

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  StructReader value;
  ListReader value_00;
  ListReader value_01;
  WirePointer *pWVar1;
  CapTableReader *pCVar2;
  SegmentReader *pSVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  bool bVar6;
  unsigned_short pointerCount_00;
  unsigned_short uVar7;
  unsigned_short uVar8;
  Kind KVar9;
  WordCountN<29> WVar10;
  ListElementCount i;
  WordCountN<17> WVar11;
  BitsPerElementTableType structDataSize;
  PointersPerElementN<1> PVar12;
  ElementCountN<29> i_00;
  uint uVar13;
  WirePointer *pWVar14;
  unsigned_long uVar15;
  WordCount64 WVar16;
  Own<capnp::ClientHook> *pOVar17;
  SegmentAnd<capnp::word_*> SVar18;
  Fault local_1d8;
  Fault f_12;
  Maybe<kj::Own<capnp::ClientHook>_> local_1c8;
  undefined1 local_1b8 [8];
  OwnOwn<capnp::ClientHook> cap;
  Fault f_11;
  Fault f_10;
  Fault f_9;
  CapTableReader *pCStack_188;
  byte *local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  Fault local_160;
  Fault f_8;
  Fault f_7;
  WordCount64 wordCount_1;
  ElementCountN<29> elementCount_1;
  uint step;
  uint pointerCount;
  uint dataSize;
  CapTableReader *pCStack_130;
  byte *local_128;
  undefined8 uStack_120;
  StructDataBitCount local_118;
  StructPointerCount SStack_114;
  ElementSize EStack_112;
  undefined1 uStack_111;
  int iStack_110;
  undefined4 uStack_10c;
  Fault local_108;
  Fault f_6;
  Fault f_5;
  uint wordsPerElement;
  ListElementCount elementCount;
  Fault f_4;
  Fault f_3;
  WirePointer *tag;
  WordCountN<29> wordCount;
  Fault f_2;
  undefined1 auStack_c0 [7];
  ElementSize elementSize;
  CapTableReader *pCStack_b8;
  void *local_b0;
  WirePointer *pWStack_a8;
  StructDataBitCount local_a0;
  StructPointerCount SStack_9c;
  undefined2 uStack_9a;
  int iStack_98;
  undefined4 uStack_94;
  Fault local_90;
  Fault f_1;
  Fault local_78;
  Fault f;
  word *p;
  word *ptr;
  WirePointer *pWStack_50;
  bool canonical_local;
  WirePointer *src_local;
  CapTableReader *srcCapTable_local;
  SegmentReader *srcSegment_local;
  WirePointer *dst_local;
  CapTableBuilder *dstCapTable_local;
  SegmentBuilder *dstSegment_local;
  word *local_18;
  
  pWStack_50 = src;
  src_local = (WirePointer *)srcCapTable;
  srcCapTable_local = (CapTableReader *)srcSegment;
  srcSegment_local = (SegmentReader *)dst;
  dst_local = (WirePointer *)dstCapTable;
  dstCapTable_local = (CapTableBuilder *)dstSegment;
  bVar6 = WirePointer::isNull(src);
  if (!bVar6) {
    f.exception = (Exception *)
                  followFars(&stack0xffffffffffffffb0,srcTarget,(SegmentReader **)&srcCapTable_local
                            );
    pWVar14 = (WirePointer *)kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&f);
    if (pWVar14 != (WirePointer *)0x0) {
      KVar9 = WirePointer::kind(pWStack_50);
      pCVar2 = srcCapTable_local;
      switch(KVar9) {
      case STRUCT:
        if (nestingLimit < 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                    (&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7a1,FAILED,"nestingLimit > 0",
                     "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                     ,(char (*) [76])
                      "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.")
          ;
          kj::_::Debug::Fault::~Fault(&local_78);
        }
        else {
          WVar11 = WirePointer::StructRef::wordSize(&(pWStack_50->field_1).structRef);
          bVar6 = boundsCheck((SegmentReader *)pCVar2,(word *)pWVar14,WVar11);
          pCVar5 = dstCapTable_local;
          pWVar4 = dst_local;
          pSVar3 = srcSegment_local;
          pCVar2 = srcCapTable_local;
          pWVar1 = src_local;
          if (bVar6) {
            uVar7 = DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.dataSize);
            uVar8 = DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.dataSize);
            pointerCount_00 =
                 DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.ptrCount);
            StructReader::StructReader
                      ((StructReader *)auStack_c0,(SegmentReader *)pCVar2,(CapTableReader *)pWVar1,
                       pWVar14,pWVar14 + (int)(uint)uVar7,(uint)uVar8 << 6,pointerCount_00,
                       nestingLimit + -1);
            value.capTable._0_2_ = (short)pCStack_b8;
            value.segment = _auStack_c0;
            value.capTable._2_2_ = (short)((ulong)pCStack_b8 >> 0x10);
            value.capTable._4_4_ = (int)((ulong)pCStack_b8 >> 0x20);
            value.data._0_4_ = (int)local_b0;
            value.data._4_4_ = (int)((ulong)local_b0 >> 0x20);
            value.pointers._0_4_ = (int)pWStack_a8;
            value.pointers._4_4_ = (int)((ulong)pWStack_a8 >> 0x20);
            value.dataSize = local_a0;
            value.pointerCount = SStack_9c;
            value._38_2_ = uStack_9a;
            value.nestingLimit = iStack_98;
            value._44_4_ = uStack_94;
            SVar18 = setStructPointer((SegmentBuilder *)pCVar5,(CapTableBuilder *)pWVar4,
                                      (WirePointer *)pSVar3,value,orphanArena,canonical);
            return SVar18;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                    (&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7a6,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                     "\"Message contained out-of-bounds struct pointer.\"",
                     (char (*) [48])"Message contained out-of-bounds struct pointer.");
          kj::_::Debug::Fault::~Fault(&local_90);
        }
        break;
      case LIST:
        f_2.exception._7_1_ = WirePointer::ListRef::elementSize(&(pWStack_50->field_1).listRef);
        if (nestingLimit < 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                    ((Fault *)&stack0xffffffffffffff30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7b5,FAILED,"nestingLimit > 0",
                     "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                     ,(char (*) [76])
                      "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.")
          ;
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff30);
        }
        else if (f_2.exception._7_1_ == INLINE_COMPOSITE) {
          WVar10 = WirePointer::ListRef::inlineCompositeWordCount(&(pWStack_50->field_1).listRef);
          bVar6 = boundsCheck((SegmentReader *)srcCapTable_local,(word *)pWVar14,WVar10 + 1);
          if (bVar6) {
            KVar9 = WirePointer::kind(pWVar14);
            if (KVar9 == STRUCT) {
              i = WirePointer::inlineCompositeListElementCount(pWVar14);
              WVar11 = WirePointer::StructRef::wordSize(&(pWVar14->field_1).structRef);
              uVar15 = upgradeBound<unsigned_long,unsigned_int>(i);
              if (WVar11 * uVar15 < (ulong)WVar10 || WVar11 * uVar15 - (ulong)WVar10 == 0) {
                if ((WVar11 != 0) ||
                   (bVar6 = amplifiedRead((SegmentReader *)srcCapTable_local,i), bVar6)) {
                  pCVar5 = dstCapTable_local;
                  pWVar4 = dst_local;
                  pSVar3 = srcSegment_local;
                  pCVar2 = srcCapTable_local;
                  pWVar1 = src_local;
                  uVar7 = DirectWireValue<unsigned_short>::get
                                    (&(pWVar14->field_1).structRef.dataSize);
                  uVar8 = DirectWireValue<unsigned_short>::get
                                    (&(pWVar14->field_1).structRef.ptrCount);
                  ListReader::ListReader
                            ((ListReader *)&pointerCount,(SegmentReader *)pCVar2,
                             (CapTableReader *)pWVar1,pWVar14 + 1,i,WVar11 << 6,(uint)uVar7 << 6,
                             uVar8,INLINE_COMPOSITE,nestingLimit + -1);
                  value_00.capTable._0_2_ = (short)pCStack_130;
                  value_00.segment = _pointerCount;
                  value_00.capTable._2_2_ = (short)((ulong)pCStack_130 >> 0x10);
                  value_00.capTable._4_4_ = (int)((ulong)pCStack_130 >> 0x20);
                  value_00.ptr._0_4_ = (int)local_128;
                  value_00.ptr._4_4_ = (int)((ulong)local_128 >> 0x20);
                  value_00.elementCount = (ListElementCount)uStack_120;
                  value_00.step = SUB84(uStack_120,4);
                  value_00.structDataSize = local_118;
                  value_00.structPointerCount = SStack_114;
                  value_00.elementSize = EStack_112;
                  value_00._39_1_ = uStack_111;
                  value_00.nestingLimit = iStack_110;
                  value_00._44_4_ = uStack_10c;
                  SVar18 = setListPointer((SegmentBuilder *)pCVar5,(CapTableBuilder *)pWVar4,
                                          (WirePointer *)pSVar3,value_00,orphanArena,canonical);
                  return SVar18;
                }
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                          (&local_108,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x7d5,FAILED,
                           "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                           "\"Message contains amplified list pointer.\"",
                           (char (*) [41])"Message contains amplified list pointer.");
                kj::_::Debug::Fault::~Fault(&local_108);
              }
              else {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                          (&f_6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x7cd,FAILED,
                           "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                           "\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                           (char (*) [57])
                           "INLINE_COMPOSITE list\'s elements overrun its word count.");
                kj::_::Debug::Fault::~Fault(&f_6);
              }
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                        ((Fault *)&wordsPerElement,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7c5,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
              kj::_::Debug::Fault::~Fault((Fault *)&wordsPerElement);
            }
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                      (&f_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7be,FAILED,
                       "boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                       "\"Message contains out-of-bounds list pointer.\"",
                       (char (*) [45])"Message contains out-of-bounds list pointer.");
            kj::_::Debug::Fault::~Fault(&f_4);
          }
        }
        else {
          structDataSize = dataBitsPerElement(f_2.exception._7_1_);
          PVar12 = pointersPerElement(f_2.exception._7_1_);
          uVar13 = structDataSize + PVar12 * 0x40;
          i_00 = WirePointer::ListRef::elementCount(&(pWStack_50->field_1).listRef);
          uVar15 = upgradeBound<unsigned_long,unsigned_int>(i_00);
          WVar16 = roundBitsUpToWords(uVar15 * uVar13);
          bVar6 = boundsCheck((SegmentReader *)srcCapTable_local,(word *)pWVar14,
                              (WordCountN<31>)WVar16);
          if (bVar6) {
            if ((f_2.exception._7_1_ != VOID) ||
               (bVar6 = amplifiedRead((SegmentReader *)srcCapTable_local,i_00), bVar6)) {
              pCVar5 = dstCapTable_local;
              pWVar1 = dst_local;
              pSVar3 = srcSegment_local;
              ListReader::ListReader
                        ((ListReader *)&f_9,(SegmentReader *)srcCapTable_local,
                         (CapTableReader *)src_local,pWVar14,i_00,uVar13,structDataSize,
                         (StructPointerCount)PVar12,f_2.exception._7_1_,nestingLimit + -1);
              value_01.capTable._0_2_ = (short)pCStack_188;
              value_01.segment = (SegmentReader *)f_9.exception;
              value_01.capTable._2_2_ = (short)((ulong)pCStack_188 >> 0x10);
              value_01.capTable._4_4_ = (int)((ulong)pCStack_188 >> 0x20);
              value_01.ptr._0_4_ = (int)local_180;
              value_01.ptr._4_4_ = (int)((ulong)local_180 >> 0x20);
              value_01.elementCount = (ListElementCount)uStack_178;
              value_01.step = SUB84(uStack_178,4);
              value_01._32_8_ = local_170;
              value_01._40_8_ = uStack_168;
              SVar18 = setListPointer((SegmentBuilder *)pCVar5,(CapTableBuilder *)pWVar1,
                                      (WirePointer *)pSVar3,value_01,orphanArena,canonical);
              return SVar18;
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                      (&local_160,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7f1,FAILED,
                       "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                       "\"Message contains amplified list pointer.\"",
                       (char (*) [41])"Message contains amplified list pointer.");
            kj::_::Debug::Fault::~Fault(&local_160);
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                      (&f_8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7e9,FAILED,"boundsCheck(srcSegment, ptr, wordCount)",
                       "\"Message contains out-of-bounds list pointer.\"",
                       (char (*) [45])"Message contains out-of-bounds list pointer.");
            kj::_::Debug::Fault::~Fault(&f_8);
          }
        }
        break;
      case FAR:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  (&f_10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x7fe,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                   (char (*) [24])"Unexpected FAR pointer.");
        kj::_::Debug::Fault::~Fault(&f_10);
        break;
      case OTHER:
        bVar6 = WirePointer::isCapability(pWStack_50);
        if (bVar6) {
          if (canonical) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                      ((Fault *)&cap.value.ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x808,FAILED,(char *)0x0,
                       "\"Cannot create a canonical message with a capability\"",
                       (char (*) [52])"Cannot create a canonical message with a capability");
            kj::_::Debug::Fault::~Fault((Fault *)&cap.value.ptr);
          }
          pWVar14 = src_local;
          uVar13 = DirectWireValue<unsigned_int>::get
                             ((DirectWireValue<unsigned_int> *)&(pWStack_50->field_1).structRef);
          (**(code **)*pWVar14)(&local_1c8,pWVar14,uVar13);
          kj::_::readMaybe<capnp::ClientHook>((_ *)local_1b8,&local_1c8);
          kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe(&local_1c8);
          pOVar17 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_1b8);
          pCVar5 = dstCapTable_local;
          pWVar14 = dst_local;
          pSVar3 = srcSegment_local;
          if (pOVar17 == (Own<capnp::ClientHook> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                      (&local_1d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x813,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\""
                       ,(char (*) [46])"Message contained invalid capability pointer.");
            f_12.exception._4_4_ = 2;
            kj::_::Debug::Fault::~Fault(&local_1d8);
          }
          else {
            pOVar17 = kj::_::OwnOwn<capnp::ClientHook>::operator*
                                ((OwnOwn<capnp::ClientHook> *)local_1b8);
            pOVar17 = kj::mv<kj::Own<capnp::ClientHook>>(pOVar17);
            setCapabilityPointer
                      ((SegmentBuilder *)pCVar5,(CapTableBuilder *)pWVar14,(WirePointer *)pSVar3,
                       pOVar17);
            local_18 = (word *)0x1;
            dstSegment_local = (SegmentBuilder *)dstCapTable_local;
            f_12.exception._4_4_ = 1;
          }
          kj::_::OwnOwn<capnp::ClientHook>::~OwnOwn((OwnOwn<capnp::ClientHook> *)local_1b8);
          if (f_12.exception._4_4_ == 1) {
            return _dstSegment_local;
          }
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                    (&f_11,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x803,FAILED,"src->isCapability()","\"Unknown pointer type.\"",
                     (char (*) [22])"Unknown pointer type.");
          kj::_::Debug::Fault::~Fault(&f_11);
        }
        break;
      default:
        kj::_::unreachable();
      }
    }
  }
  bVar6 = WirePointer::isNull((WirePointer *)srcSegment_local);
  if (!bVar6) {
    zeroObject((SegmentBuilder *)dstCapTable_local,(CapTableBuilder *)dst_local,
               (WirePointer *)srcSegment_local);
    zeroMemory((WirePointer *)srcSegment_local);
  }
  local_18 = (word *)0x0;
  dstSegment_local = (SegmentBuilder *)dstCapTable_local;
  return _dstSegment_local;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_MAYBE(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_MAYBE(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(*cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }